

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_then_finally_func
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  int argc_00;
  code *func;
  JSValue JVar1;
  JSValue JVar2;
  JSValue local_50;
  JSValue local_40;
  
  JVar2 = *func_data;
  argc_00 = 0;
  JVar1 = JS_Call(ctx,func_data[1],(JSValue)(ZEXT816(3) << 0x40),0,(JSValue *)0x0);
  if ((int)JVar1.tag != 6) {
    local_40 = JVar1;
    JVar2 = js_promise_resolve(ctx,JVar2,argc_00,&local_40,0);
    JS_FreeValue(ctx,local_40);
    JVar1 = JVar2;
    if ((int)JVar2.tag != 6) {
      func = js_promise_finally_thrower;
      if (magic == 0) {
        func = js_promise_finally_value_thunk;
      }
      JVar1 = JS_NewCFunctionData(ctx,func,0,0,1,argv);
      local_50 = JVar1;
      if ((int)JVar1.tag == 6) {
        JS_FreeValue(ctx,JVar2);
      }
      else {
        JVar1 = JS_InvokeFree(ctx,JVar2,0x7f,1,&local_50);
        JS_FreeValue(ctx,local_50);
      }
    }
  }
  return JVar1;
}

Assistant:

static JSValue js_promise_then_finally_func(JSContext *ctx, JSValueConst this_val,
                                            int argc, JSValueConst *argv,
                                            int magic, JSValue *func_data)
{
    JSValueConst ctor = func_data[0];
    JSValueConst onFinally = func_data[1];
    JSValue res, promise, ret, then_func;

    res = JS_Call(ctx, onFinally, JS_UNDEFINED, 0, NULL);
    if (JS_IsException(res))
        return res;
    promise = js_promise_resolve(ctx, ctor, 1, (JSValueConst *)&res, 0);
    JS_FreeValue(ctx, res);
    if (JS_IsException(promise))
        return promise;
    if (magic == 0) {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_value_thunk, 0,
                                        0, 1, argv);
    } else {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_thrower, 0,
                                        0, 1, argv);
    }
    if (JS_IsException(then_func)) {
        JS_FreeValue(ctx, promise);
        return then_func;
    }
    ret = JS_InvokeFree(ctx, promise, JS_ATOM_then, 1, (JSValueConst *)&then_func);
    JS_FreeValue(ctx, then_func);
    return ret;
}